

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O2

void __thiscall
helics::MessageDataOperator::MessageDataOperator
          (MessageDataOperator *this,function<void_(helics::SmallBuffer_&)> *userDataFunction)

{
  (this->super_FilterOperator)._vptr_FilterOperator =
       (_func_int **)&PTR__MessageDataOperator_004cb2c8;
  std::function<void_(helics::SmallBuffer_&)>::function(&this->dataFunction,userDataFunction);
  return;
}

Assistant:

MessageDataOperator::MessageDataOperator(std::function<void(SmallBuffer&)> userDataFunction):
    dataFunction(std::move(userDataFunction))
{
}